

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t writen(int fd,string *sbuff)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  string local_60 [32];
  void *local_40;
  char *ptr;
  ssize_t writeSum;
  ssize_t nwritten;
  size_t nleft;
  string *sbuff_local;
  int fd_local;
  
  nleft = (size_t)sbuff;
  sbuff_local._4_4_ = fd;
  nwritten = std::__cxx11::string::size();
  writeSum = 0;
  ptr = (char *)0x0;
  local_40 = (void *)std::__cxx11::string::c_str();
LAB_00163039:
  do {
    if (nwritten == 0) {
LAB_001630b9:
      pcVar1 = ptr;
      iVar2 = std::__cxx11::string::size();
      if (pcVar1 == (char *)(long)iVar2) {
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::substr((ulong)local_60,nleft);
        std::__cxx11::string::operator=((string *)nleft,local_60);
        std::__cxx11::string::~string(local_60);
      }
      return (ssize_t)ptr;
    }
    writeSum = write(sbuff_local._4_4_,local_40,nwritten);
    if ((writeSum < 1) && (writeSum < 0)) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        piVar3 = __errno_location();
        if (*piVar3 != 0xb) {
          return -1;
        }
        goto LAB_001630b9;
      }
      writeSum = 0;
      goto LAB_00163039;
    }
    ptr = ptr + writeSum;
    nwritten = nwritten - writeSum;
    local_40 = (void *)(writeSum + (long)local_40);
  } while( true );
}

Assistant:

ssize_t writen(int fd, std::string &sbuff) {
  size_t nleft = sbuff.size();
  ssize_t nwritten = 0;
  ssize_t writeSum = 0;
  const char *ptr = sbuff.c_str();
  while (nleft > 0) {
    if ((nwritten = write(fd, ptr, nleft)) <= 0) {
      if (nwritten < 0) {
        if (errno == EINTR) {
          nwritten = 0;
          continue;
        } else if (errno == EAGAIN)
          break;
        else
          return -1;
      }
    }
    writeSum += nwritten;
    nleft -= nwritten;
    ptr += nwritten;
  }
  if (writeSum == static_cast<int>(sbuff.size()))
    sbuff.clear();
  else
    sbuff = sbuff.substr(writeSum);
  return writeSum;
}